

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O0

Reals __thiscall
Omega_h::get_curv_vert_tangents_dim<2>
          (Omega_h *this,Mesh *mesh,LOs *curv_edge2edge,Reals *curv_edge_tangents,
          LOs *curv_vert2vert)

{
  int size_in;
  bool bVar1;
  Int IVar2;
  LO nb;
  void *extraout_RDX;
  Reals RVar3;
  Read<double> local_300;
  Read<int> local_2f0;
  Read<double> local_2e0;
  undefined1 local_2d0 [80];
  undefined1 local_280 [8];
  Reals curv_vert_tangents;
  Adj local_260;
  undefined1 local_230 [8];
  Reals weights;
  undefined1 local_210 [8];
  Reals arcs2tangents;
  type f;
  Adj local_180;
  undefined1 local_150 [8];
  Read<signed_char> arcs2flip;
  string local_138 [32];
  undefined1 local_118 [8];
  Write<double> arcs2tangents_w;
  undefined1 local_f8 [8];
  LOs edge2curv_edge;
  undefined1 local_e0 [4];
  LO narcs;
  Read<int> local_a0;
  undefined1 local_90 [8];
  Adj curv_verts2edges;
  Adj verts2edges;
  LOs *curv_vert2vert_local;
  Reals *curv_edge_tangents_local;
  LOs *curv_edge2edge_local;
  Mesh *mesh_local;
  
  IVar2 = Mesh::dim(mesh);
  if (IVar2 != 2) {
    fail("assertion %s failed at %s +%d\n","mesh->dim() == dim",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_surface.cpp"
         ,0x109);
  }
  bVar1 = Mesh::owners_have_all_upward(mesh,0);
  if (!bVar1) {
    fail("assertion %s failed at %s +%d\n","mesh->owners_have_all_upward(VERT)",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_surface.cpp"
         ,0x10a);
  }
  Mesh::ask_up((Adj *)&curv_verts2edges.codes.write_.shared_alloc_.direct_ptr,mesh,0,1);
  Read<int>::Read(&local_a0,curv_vert2vert);
  Adj::Adj((Adj *)local_e0,(Adj *)&curv_verts2edges.codes.write_.shared_alloc_.direct_ptr);
  unmap_adjacency((Adj *)local_90,&local_a0,(Adj *)local_e0);
  Adj::~Adj((Adj *)local_e0);
  Read<int>::~Read(&local_a0);
  edge2curv_edge.write_.shared_alloc_.direct_ptr._4_4_ = Graph::nedges((Graph *)local_90);
  Read<int>::Read((Read<int> *)&arcs2tangents_w.shared_alloc_.direct_ptr,curv_edge2edge);
  nb = Mesh::nedges(mesh);
  invert_injective_map((Omega_h *)local_f8,(LOs *)&arcs2tangents_w.shared_alloc_.direct_ptr,nb);
  Read<int>::~Read((Read<int> *)&arcs2tangents_w.shared_alloc_.direct_ptr);
  size_in = edge2curv_edge.write_.shared_alloc_.direct_ptr._4_4_ * 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_138,"",(allocator *)((long)&arcs2flip.write_.shared_alloc_.direct_ptr + 7));
  Write<double>::Write((Write<double> *)local_118,size_in,(string *)local_138);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&arcs2flip.write_.shared_alloc_.direct_ptr + 7));
  Adj::Adj(&local_180,(Adj *)local_90);
  Read<int>::Read((Read<int> *)&f.arcs2flip.write_.shared_alloc_.direct_ptr,(Read<int> *)local_f8);
  get_curv_vert_edge_flips
            ((Omega_h *)local_150,&local_180,(LOs *)&f.arcs2flip.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&f.arcs2flip.write_.shared_alloc_.direct_ptr);
  Adj::~Adj(&local_180);
  Adj::Adj((Adj *)&arcs2tangents.write_.shared_alloc_.direct_ptr,(Adj *)local_90);
  Read<int>::Read((Read<int> *)&f.curv_verts2edges.codes.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_f8);
  Write<double>::Write
            ((Write<double> *)&f.edge2curv_edge.write_.shared_alloc_.direct_ptr,
             (Write<double> *)local_118);
  Read<double>::Read((Read<double> *)&f.arcs2tangents_w.shared_alloc_.direct_ptr,curv_edge_tangents)
  ;
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.curv_edge_tangents.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_150);
  parallel_for<Omega_h::get_curv_vert_tangents_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>)::_lambda(int)_1_>
            (edge2curv_edge.write_.shared_alloc_.direct_ptr._4_4_,
             (type *)&arcs2tangents.write_.shared_alloc_.direct_ptr,"get_curv_vert_tangents");
  Write<double>::Write
            ((Write<double> *)&weights.write_.shared_alloc_.direct_ptr,(Write<double> *)local_118);
  Read<double>::Read((Read<double> *)local_210,
                     (Write<double> *)&weights.write_.shared_alloc_.direct_ptr);
  Write<double>::~Write((Write<double> *)&weights.write_.shared_alloc_.direct_ptr);
  Adj::Adj(&local_260,(Adj *)local_90);
  Read<int>::Read((Read<int> *)&curv_vert_tangents.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_f8);
  get_recip_length_weights
            ((Omega_h *)local_230,mesh,&local_260,
             (LOs *)&curv_vert_tangents.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&curv_vert_tangents.write_.shared_alloc_.direct_ptr);
  Adj::~Adj(&local_260);
  Graph::Graph((Graph *)(local_2d0 + 0x30),(Graph *)local_90);
  Read<double>::Read((Read<double> *)(local_2d0 + 0x20),(Read<double> *)local_230);
  Read<double>::Read((Read<double> *)(local_2d0 + 0x10),(Read<double> *)local_210);
  graph_weighted_average_arc_data
            ((Omega_h *)local_280,(Graph *)(local_2d0 + 0x30),(Reals *)(local_2d0 + 0x20),
             (Reals *)(local_2d0 + 0x10),2);
  Read<double>::~Read((Read<double> *)(local_2d0 + 0x10));
  Read<double>::~Read((Read<double> *)(local_2d0 + 0x20));
  Graph::~Graph((Graph *)(local_2d0 + 0x30));
  Read<double>::Read(&local_2e0,(Read<double> *)local_280);
  Read<int>::Read(&local_2f0,curv_vert2vert);
  Mesh::sync_subset_array<double>
            ((Mesh *)local_2d0,(Int)mesh,(Read<double> *)0x0,(LOs *)&local_2e0,0.0,(Int)&local_2f0);
  Read<double>::operator=((Read<double> *)local_280,(Read<double> *)local_2d0);
  Read<double>::~Read((Read<double> *)local_2d0);
  Read<int>::~Read(&local_2f0);
  Read<double>::~Read(&local_2e0);
  Read<double>::Read(&local_300,(Read<double> *)local_280);
  normalize_vectors(this,&local_300,2);
  Read<double>::~Read(&local_300);
  Read<double>::~Read((Read<double> *)local_280);
  Read<double>::~Read((Read<double> *)local_230);
  Read<double>::~Read((Read<double> *)local_210);
  get_curv_vert_tangents_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>)
  ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&arcs2tangents.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)local_150);
  Write<double>::~Write((Write<double> *)local_118);
  Read<int>::~Read((Read<int> *)local_f8);
  Adj::~Adj((Adj *)local_90);
  Adj::~Adj((Adj *)&curv_verts2edges.codes.write_.shared_alloc_.direct_ptr);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals get_curv_vert_tangents_dim(Mesh* mesh, LOs curv_edge2edge,
    Reals curv_edge_tangents, LOs curv_vert2vert) {
  OMEGA_H_CHECK(mesh->dim() == dim);
  OMEGA_H_CHECK(mesh->owners_have_all_upward(VERT));
  auto verts2edges = mesh->ask_up(VERT, EDGE);
  auto curv_verts2edges = unmap_adjacency(curv_vert2vert, verts2edges);
  auto narcs = curv_verts2edges.nedges();
  auto edge2curv_edge = invert_injective_map(curv_edge2edge, mesh->nedges());
  auto arcs2tangents_w = Write<Real>(narcs * dim);
  auto arcs2flip = get_curv_vert_edge_flips(curv_verts2edges, edge2curv_edge);
  auto f = OMEGA_H_LAMBDA(LO arc) {
    auto e = curv_verts2edges.ab2b[arc];
    auto ce = edge2curv_edge[e];
    if (-1 == ce)
      set_vector(arcs2tangents_w, arc, zero_vector<dim>());
    else {
      auto tangent = get_vector<dim>(curv_edge_tangents, ce);
      if (arcs2flip[arc]) tangent = -tangent;
      set_vector(arcs2tangents_w, arc, tangent);
    }
  };
  parallel_for(narcs, f, "get_curv_vert_tangents");
  auto arcs2tangents = Reals(arcs2tangents_w);
  auto weights =
      get_recip_length_weights(mesh, curv_verts2edges, edge2curv_edge);
  auto curv_vert_tangents = graph_weighted_average_arc_data(
      curv_verts2edges, weights, arcs2tangents, dim);
  curv_vert_tangents = mesh->sync_subset_array(
      VERT, curv_vert_tangents, curv_vert2vert, 0.0, dim);
  return normalize_vectors(curv_vert_tangents, dim);
}